

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O1

void Mvc_CoverAddCubeHead_(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  int *piVar1;
  Mvc_Cube_t *pMVar2;
  Mvc_List_t *pMVar3;
  
  pMVar2 = (pCover->lCubes).pHead;
  if (pMVar2 == (Mvc_Cube_t *)0x0) {
    pCube->pNext = (Mvc_Cube_t *)0x0;
    (pCover->lCubes).pHead = pCube;
    pMVar3 = (Mvc_List_t *)&(pCover->lCubes).pTail;
  }
  else {
    pMVar3 = &pCover->lCubes;
    pCube->pNext = pMVar2;
  }
  pMVar3->pHead = pCube;
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Mvc_CoverAddCubeHead_( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    Mvc_List_t * pList = &pCover->lCubes;
    if ( pList->pHead == NULL )
    {
        Mvc_CubeSetNext( pCube, NULL );
        pList->pHead = pCube;
        pList->pTail = pCube;
    }
    else
    {
        Mvc_CubeSetNext( pCube, pList->pHead );
        pList->pHead = pCube;
    }
    pList->nItems++;
}